

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrAtom::RandStrAtom(RandStrAtom *this,RandStrParser *p)

{
  wchar_t wVar1;
  int iVar2;
  RandStrNode *pRVar3;
  RandStrParser *in_RSI;
  RandStrNode *in_RDI;
  bool bVar4;
  wchar_t c2;
  wchar_t c1;
  wchar_t in_stack_ffffffffffffff78;
  wchar_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_64;
  wchar_t local_54;
  wchar_t local_44;
  wchar_t local_20;
  
  RandStrNode::RandStrNode(in_RDI);
  in_RDI->_vptr_RandStrNode = (_func_int **)&PTR__RandStrAtom_0043fca0;
  *(undefined4 *)&in_RDI[1]._vptr_RandStrNode = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_RandStrNode + 4) = 0;
  *(undefined4 *)&in_RDI[1].firstChild = 0;
  wVar1 = RandStrParser::getch
                    ((RandStrParser *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  if (wVar1 == L'[') {
    RandStrParser::skip((RandStrParser *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    while( true ) {
      iVar2 = RandStrParser::more(in_RSI);
      bVar4 = false;
      if (iVar2 != 0) {
        wVar1 = RandStrParser::getch
                          ((RandStrParser *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        bVar4 = wVar1 != L']';
      }
      if (!bVar4) break;
      local_20 = RandStrParser::getch
                           ((RandStrParser *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (local_20 == L'%') {
        RandStrParser::skip((RandStrParser *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        iVar2 = RandStrParser::more(in_RSI);
        if (iVar2 == 0) {
          local_44 = L'%';
        }
        else {
          local_44 = RandStrParser::getch
                               ((RandStrParser *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        local_20 = local_44;
      }
      RandStrParser::skip((RandStrParser *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      wVar1 = RandStrParser::getch
                        ((RandStrParser *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (wVar1 == L'-') {
        RandStrParser::skip((RandStrParser *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        wVar1 = RandStrParser::getch
                          ((RandStrParser *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (wVar1 == L'%') {
          RandStrParser::skip((RandStrParser *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        iVar2 = RandStrParser::more(in_RSI);
        if (iVar2 == 0) {
          local_54 = local_20;
        }
        else {
          local_54 = RandStrParser::getch
                               ((RandStrParser *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        RandStrParser::skip((RandStrParser *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        pRVar3 = (RandStrNode *)operator_new(0x28);
        RandStrRange::RandStrRange
                  ((RandStrRange *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        RandStrNode::addChild(in_RDI,pRVar3);
        if (local_20 < local_54) {
          local_64 = local_54 - local_20;
        }
        else {
          local_64 = local_20 - local_54;
        }
        *(int *)&in_RDI[1].firstChild = local_64 + 1 + *(int *)&in_RDI[1].firstChild;
      }
      else {
        pRVar3 = (RandStrNode *)operator_new(0x28);
        RandStrRange::RandStrRange
                  ((RandStrRange *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        RandStrNode::addChild(in_RDI,pRVar3);
        *(int *)&in_RDI[1].firstChild = *(int *)&in_RDI[1].firstChild + 1;
      }
    }
    RandStrParser::skip((RandStrParser *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    wVar1 = RandStrParser::getch
                      ((RandStrParser *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (wVar1 == L'%') {
      RandStrParser::skip((RandStrParser *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      iVar2 = RandStrParser::more(in_RSI);
      if (iVar2 == 0) {
        wVar1 = L'%';
      }
      else {
        wVar1 = RandStrParser::getch
                          ((RandStrParser *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      *(wchar_t *)&in_RDI[1]._vptr_RandStrNode = wVar1;
      *(undefined4 *)((long)&in_RDI[1]._vptr_RandStrNode + 4) = 1;
      RandStrParser::skip((RandStrParser *)CONCAT44(wVar1,in_stack_ffffffffffffff80));
    }
    else {
      wVar1 = RandStrParser::getch
                        ((RandStrParser *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      *(wchar_t *)&in_RDI[1]._vptr_RandStrNode = wVar1;
      RandStrParser::skip((RandStrParser *)CONCAT44(in_stack_ffffffffffffff84,wVar1));
    }
  }
  return;
}

Assistant:

RandStrAtom(class RandStrParser *p)
    {
        /* we don't have a character class or literal character yet */
        ch = 0;
        isLit = FALSE;
        
        /* we have no character list items yet */
        listChars = 0;
        
        /* check for a character list of the form [abcw-z] */
        if (p->getch() == '[')
        {
            /* keep going until we reach the ']' or end of string */
            for (p->skip() ; p->more() && p->getch() != ']' ; )
            {
                /* get the next character */
                wchar_t c1 = p->getch();

                /* check for quoting */
                if (c1 == '%')
                {
                    /* skip the '%' and get the quoted character */
                    p->skip();
                    c1 = (p->more() ? p->getch() : '%');
                }

                /* skip the character */
                p->skip();

                /* if the next character is '-', we have a range expression */
                if (p->getch() == '-')
                {
                    /* skip the '-' */
                    p->skip();

                    /* if there's a '%', skip it as well */
                    if (p->getch() == '%')
                        p->skip();

                    /* get the upper bound character */
                    wchar_t c2 = (p->more() ? p->getch() : c1);

                    /* skip the second character */
                    p->skip();

                    /* add the range */
                    addChild(new RandStrRange(c1, c2));
                    listChars += (c2 > c1 ? c2 - c1 : c1 - c2) + 1;
                }
                else
                {
                    /* it's just this character in the range */
                    addChild(new RandStrRange(c1, c1));
                    listChars += 1;
                }
            }

            /* skip the ']' */
            p->skip();
        }
        else if (p->getch() == '%')
        {
            /* 
             *   quoted character expression - skip the '%' and store the
             *   single character 
             */
            p->skip();
            ch = p->more() ? p->getch() : '%';

            /* note that this is a literal character expression */
            isLit = TRUE;

            /* skip the character */
            p->skip();
        }
        else
        {
            /* character class expression - store it and skip it */
            ch = p->getch();
            p->skip();
        }
    }